

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

void __thiscall ApplicationContext::CreateCSP(ApplicationContext *this)

{
  CSP *pCVar1;
  thread *in_RDI;
  size_t in_stack_000000c0;
  char *in_stack_000000c8;
  CSP *in_stack_000000d0;
  thread *__t;
  thread *this_00;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffef8;
  anon_class_8_1_8991fb9c *__f;
  function<void_(int)> *in_stack_ffffffffffffff00;
  function<void_(int)> *this_01;
  type *__f_00;
  thread in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CSP *in_stack_ffffffffffffff60;
  function<void_(int)> local_88 [4];
  
  __f_00 = (type *)csp_ac_src;
  strlen(csp_ac_src);
  pCVar1 = csp_parse(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  in_RDI[0xe]._M_id._M_thread = (native_handle_type)pCVar1;
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_1_,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  csp_bind_lambda(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  (function<void_(int)> *)in_stack_ffffffffffffff50._M_id._M_thread);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12b49a);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_2_,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  csp_bind_lambda(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  (function<void_(int)> *)in_stack_ffffffffffffff50._M_id._M_thread);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12b4ef);
  __f = (anon_class_8_1_8991fb9c *)in_RDI[0xe]._M_id._M_thread;
  this_01 = local_88;
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_3_,void>
            (this_01,__f);
  csp_bind_lambda(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  (function<void_(int)> *)in_stack_ffffffffffffff50._M_id._M_thread);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12b544);
  __t = (thread *)in_RDI[0xe]._M_id._M_thread;
  this_00 = (thread *)&stack0xffffffffffffff50;
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_4_,void>
            (this_01,__f);
  csp_bind_lambda(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  (function<void_(int)> *)in_stack_ffffffffffffff50._M_id._M_thread);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12b58b);
  std::thread::thread<ApplicationContext::CreateCSP()::_lambda()_1_,,void>(in_RDI,__f_00);
  std::thread::operator=(this_00,__t);
  std::thread::~thread((thread *)0x12b5c1);
  return;
}

Assistant:

void CreateCSP()
    {
        csp = csp_parse(nullptr, csp_ac_src, strlen(csp_ac_src));

        csp_bind_lambda(csp, "append_line", [this](int id)
        {
            if (id)
            {
                ///>
                /// The append line event comes with a string to append,
                /// so fetch the data from the blackboard, and coerce it to be a string.
                /// If that works, append it to the lines buffer.
                ///<C++
                TypedData* d = blackboard_get(blackboard, id);
                auto td = dynamic_cast<Data<std::string>*>(d);
                if (td)
                {
                    ///>
                    /// append line must append the line.
                    ///<C++
                    lines.push_back(td->value());
                    ///>
                    /// The operation modified the ApplicationContext, so record the operation
                    /// in the journal. The journal will come in handy later during the discussion
                    /// of undo and redo. For now, the journal merely records what happened.
                    /// If a journal where to be played forward on another ApplicationContext,
                    /// the other ApplicationContext should achieve the identical state of the 
                    /// first ApplicationContext. Of course, in a large or long-running
                    /// application, it might be impractical to record every action; this
                    /// too will be a topic for a later chapter.
                    ///<C++
                    journal.emplace_back(std::move(JournalEntry{"append_line", d}));
                }
                else
                {
                    ///>
                    /// The data from the blackboard is not reference counted
                    /// so it must be deleted here.
                    ///<C++
                    delete d;
                }
            }
        });
        csp_bind_lambda(csp, "pop_line", [this](int)
        {
            if (lines.size())
            {
                lines.pop_back();
                journal.emplace_back(std::move(JournalEntry{"pop_line", nullptr}));
            }
        });
        ///>
        /// Whenever a tick occurs; the variable count will be incremented.
        ///<C++
        csp_bind_lambda(csp, "tick", [this](int)
        {
            ++count;
            ///>
            /// Ticking is not an action that was initiated by the user and doesn't
            /// need to appear in a journal.
            ///<C++
        });
        ///>
        /// The join_now action is here, bound by name to the csp QUIT process.
        ///<C++
        csp_bind_lambda(csp, "join_now", [this](int) { join_now = true; });
        ///>

        /// A demonstration thread that runs at 10Hz, emitting ticks as it goes.
        /// This shows a very simple way that threads can communicate.
        ///<C++
        clock = std::thread([this]()
        {
            while (!join_now)
            {
                csp_emit(csp, "tick", 0);
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }
        });
    }